

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool ON_NurbsArcToArcTransitionIsNotGsmooth
               (ON_NurbsCurve *nurbs_curve,int knot_index,double cos_angle_tolerance,
               double curvature_tolerance)

{
  bool bVar1;
  double dVar2;
  undefined1 local_1c0 [8];
  ON_Arc arc1;
  undefined1 local_118 [8];
  ON_Arc arc0;
  undefined1 local_78 [7];
  bool rc;
  ON_NurbsCurve span;
  int k1;
  int k0;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int knot_index_local;
  ON_NurbsCurve *nurbs_curve_local;
  
  if (nurbs_curve->m_is_rat == 0) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  if (nurbs_curve->m_order < 3) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  cos_angle_tolerance_local._4_4_ = knot_index;
  if (nurbs_curve->m_cv_count <= nurbs_curve->m_order) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  while( true ) {
    bVar1 = false;
    if (0 < cos_angle_tolerance_local._4_4_) {
      bVar1 = nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_ + -1] ==
              nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_];
    }
    if (!bVar1) break;
    cos_angle_tolerance_local._4_4_ = cos_angle_tolerance_local._4_4_ + -1;
  }
  if (cos_angle_tolerance_local._4_4_ <= nurbs_curve->m_order + -2) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  if (nurbs_curve->m_cv_count + -1 <= cos_angle_tolerance_local._4_4_) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  if (nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_] <
      nurbs_curve->m_knot[nurbs_curve->m_order + -2] ||
      nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_] ==
      nurbs_curve->m_knot[nurbs_curve->m_order + -2]) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  if (nurbs_curve->m_knot[nurbs_curve->m_cv_count + -1] <=
      nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_]) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  if ((nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_] !=
       nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_ + nurbs_curve->m_order + -2]) ||
     (NAN(nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_]) ||
      NAN(nurbs_curve->m_knot[cos_angle_tolerance_local._4_4_ + nurbs_curve->m_order + -2]))) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  span.m_cv._4_4_ = (cos_angle_tolerance_local._4_4_ - nurbs_curve->m_order) + 1;
  if ((nurbs_curve->m_knot[span.m_cv._4_4_] !=
       nurbs_curve->m_knot[span.m_cv._4_4_ + nurbs_curve->m_order + -2]) ||
     (NAN(nurbs_curve->m_knot[span.m_cv._4_4_]) ||
      NAN(nurbs_curve->m_knot[span.m_cv._4_4_ + nurbs_curve->m_order + -2]))) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  span.m_cv._0_4_ = cos_angle_tolerance_local._4_4_ + nurbs_curve->m_order + -1;
  if ((nurbs_curve->m_knot[(int)span.m_cv] !=
       nurbs_curve->m_knot[(int)span.m_cv + nurbs_curve->m_order + -2]) ||
     (NAN(nurbs_curve->m_knot[(int)span.m_cv]) ||
      NAN(nurbs_curve->m_knot[(int)span.m_cv + nurbs_curve->m_order + -2]))) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  dVar2 = ON_NurbsCurve::Weight(nurbs_curve,cos_angle_tolerance_local._4_4_);
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    nurbs_curve_local._7_1_ = 0;
    goto LAB_007fcb61;
  }
  ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_78);
  span.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._0_4_ = nurbs_curve->m_dim;
  span.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._4_4_ =
       nurbs_curve->m_is_rat;
  span.m_dim = nurbs_curve->m_order;
  span.m_is_rat = nurbs_curve->m_order;
  span.m_knot._0_4_ = nurbs_curve->m_cv_stride;
  span._32_8_ = nurbs_curve->m_knot + span.m_cv._4_4_;
  span._48_8_ = nurbs_curve->m_cv + span.m_cv._4_4_ * nurbs_curve->m_cv_stride;
  arc0.m_angle.m_t[1]._7_1_ = 0;
  ON_Arc::ON_Arc((ON_Arc *)local_118);
  bVar1 = ON_NurbsCurve::IsLinear((ON_NurbsCurve *)local_78,2.3283064365386963e-10);
  if ((bVar1) ||
     (bVar1 = ON_NurbsCurve::IsArc
                        ((ON_NurbsCurve *)local_78,(ON_Plane *)0x0,(ON_Arc *)local_118,
                         2.3283064365386963e-10), !bVar1)) {
LAB_007fcb11:
    span.m_knot_capacity_and_tags = 0;
    span._36_4_ = 0;
    span.m_cv_stride = 0;
    span.m_cv_capacity = 0;
    nurbs_curve_local._7_1_ = arc0.m_angle.m_t[1]._7_1_ & 1;
  }
  else {
    ON_Arc::ON_Arc((ON_Arc *)local_1c0);
    span._32_8_ = nurbs_curve->m_knot + cos_angle_tolerance_local._4_4_;
    span._48_8_ = nurbs_curve->m_cv + cos_angle_tolerance_local._4_4_ * nurbs_curve->m_cv_stride;
    bVar1 = ON_NurbsCurve::IsLinear((ON_NurbsCurve *)local_78,2.3283064365386963e-10);
    if ((bVar1) ||
       ((bVar1 = ON_NurbsCurve::IsArc
                           ((ON_NurbsCurve *)local_78,(ON_Plane *)local_118,(ON_Arc *)local_1c0,
                            2.3283064365386963e-10), !bVar1 ||
        (bVar1 = ON_ArcToArcTransitionIsNotGsmooth
                           ((ON_Arc *)local_118,(ON_Arc *)local_1c0,cos_angle_tolerance,
                            curvature_tolerance), !bVar1)))) {
      bVar1 = false;
    }
    else {
      nurbs_curve_local._7_1_ = 1;
      bVar1 = true;
    }
    ON_Arc::~ON_Arc((ON_Arc *)local_1c0);
    if (!bVar1) goto LAB_007fcb11;
  }
  ON_Arc::~ON_Arc((ON_Arc *)local_118);
  ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_78);
LAB_007fcb61:
  return (bool)(nurbs_curve_local._7_1_ & 1);
}

Assistant:

static bool ON_NurbsArcToArcTransitionIsNotGsmooth(
  const ON_NurbsCurve& nurbs_curve,
  int knot_index,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  if ( 0 == nurbs_curve.m_is_rat )
    return false;
  if ( nurbs_curve.m_order < 3 )
    return false;
  if ( nurbs_curve.m_cv_count <= nurbs_curve.m_order )
    return false;
  while ( knot_index > 0 && nurbs_curve.m_knot[knot_index-1] == nurbs_curve.m_knot[knot_index] )
    knot_index--;
  if ( knot_index <= nurbs_curve.m_order-2 )
    return false;
  if ( knot_index >= nurbs_curve.m_cv_count-1 )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] > nurbs_curve.m_knot[nurbs_curve.m_order-2]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] < nurbs_curve.m_knot[nurbs_curve.m_cv_count-1]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] == nurbs_curve.m_knot[knot_index+nurbs_curve.m_order-2]) )
    return false;
  int k0 = knot_index-nurbs_curve.m_order+1;
  if ( !(nurbs_curve.m_knot[k0] == nurbs_curve.m_knot[k0+nurbs_curve.m_order-2]) )
    return false;
  int k1 = knot_index+nurbs_curve.m_order-1;
  if ( !(nurbs_curve.m_knot[k1] == nurbs_curve.m_knot[k1+nurbs_curve.m_order-2]) )
    return false;
  if ( !(1.0 == nurbs_curve.Weight(knot_index)) )
    return false;

  ON_NurbsCurve span;
  span.m_dim = nurbs_curve.m_dim;
  span.m_is_rat = nurbs_curve.m_is_rat;
  span.m_order = nurbs_curve.m_order;
  span.m_cv_count = nurbs_curve.m_order; // no typo here, I want m_cv_count = nurbs_curve.m_order
  span.m_cv_stride = nurbs_curve.m_cv_stride;
  span.m_knot = nurbs_curve.m_knot + k0;
  span.m_cv = nurbs_curve.m_cv + k0*nurbs_curve.m_cv_stride;

  bool rc = false;
  ON_Arc arc0;
  if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(0,&arc0) )
  {
    ON_Arc arc1;
    span.m_knot = nurbs_curve.m_knot + knot_index;
    span.m_cv = nurbs_curve.m_cv + knot_index*nurbs_curve.m_cv_stride;
    if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(&arc0.plane,&arc1) )
    {
      if ( ON_ArcToArcTransitionIsNotGsmooth(arc0,arc1,cos_angle_tolerance,curvature_tolerance) )
        return true;
    }
  }

  span.m_knot = 0;
  span.m_cv = 0;

  return rc;
}